

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_policy.cpp
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main() {
  /*<<create shared_ptr `example` with per injector policy setting>>*/
  {
    // clang-format off
    auto injector = di::make_injector<custom_policy>(
      di::bind<int>().to(42)
    , di::bind<double>().to(87.0)
    );
    // clang-format on

    injector.create<example>();
  }

  /*<<create shared_ptr `example` with global policy setting>>*/
  {
    // clang-format off
    auto injector = di::make_injector(
      di::bind<int>().to(42)
    , di::bind<double>().to(87.0)
    );
    // clang-format on

    injector.create<example>();
  }
}